

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

string * __thiscall
t_perl_generator::perl_includes_abi_cxx11_(string *__return_storage_ptr__,t_perl_generator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string t_perl_generator::perl_includes() {
  string inc;

  inc  = "use 5.10.0;\n";
  inc += "use strict;\n";
  inc += "use warnings;\n";
  inc += "use Thrift::Exception;\n";
  inc += "use Thrift::MessageType;\n";
  inc += "use Thrift::Type;\n\n";

  return inc;
}